

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_util::split(string *code,string *sep)

{
  ulong in_RDX;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int count;
  size_type old_pos;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *temp;
  value_type *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  long lVar1;
  string local_c8 [16];
  string *in_stack_ffffffffffffff48;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [36];
  int local_34;
  long local_30;
  long local_28;
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1f7e19);
  local_28 = 0;
  local_30 = 0;
  local_34 = 0;
  while (local_28 != -1) {
    local_28 = std::__cxx11::string::find(local_10,local_18);
    if (local_28 == -1) {
      in_stack_ffffffffffffff10 = local_10;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_c8,(ulong)in_stack_ffffffffffffff10);
      remove_spaces(in_stack_ffffffffffffff48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)local_10);
      remove_spaces(in_stack_ffffffffffffff48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
      lVar1 = local_28;
      local_30 = std::__cxx11::string::size();
      local_30 = lVar1 + local_30;
      local_34 = local_34 + 1;
    }
  }
  return in_RDI;
}

Assistant:

vector<string> split(const string &code, const string &sep)
    {
        vector<string> temp;
        string::size_type pos = 0;
        string::size_type old_pos = 0;
        int count = 0;

        while (pos != string::npos) {
            pos = code.find(sep, old_pos);
            if (pos != string::npos) {
                temp.push_back(remove_spaces(code.substr(old_pos,pos-old_pos)));
                old_pos = pos + sep.size();
                count ++;
            }
            else {
                temp.push_back(remove_spaces(code.substr(old_pos, code.size()
                                                         - old_pos)));
            }
        }

        return temp;
    }